

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.h
# Opt level: O2

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::set_piece
          (SentencePieceText_SentencePiece *this,string *value)

{
  void *pvVar1;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  google::protobuf::internal::ArenaStringPtr::Set(&this->piece_,value,pvVar1);
  return;
}

Assistant:

inline void SentencePieceText_SentencePiece::set_piece(std::string&& value) {
  _has_bits_[0] |= 0x00000001u;
  piece_.Set(
    ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, ::std::move(value), GetArena());
  // @@protoc_insertion_point(field_set_rvalue:sentencepiece.SentencePieceText.SentencePiece.piece)
}